

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

uint32_t __thiscall
TS_program_map_section::serialize
          (TS_program_map_section *this,uint8_t *buffer,int max_buf_size,bool blurayMode,
          bool hdmvDescriptors)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint16_t uVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  uint value;
  uint8_t *buffer_00;
  undefined3 in_register_00000081;
  int j;
  long lVar14;
  uint64_t i_count;
  BitStreamWriter bitWriter;
  int local_68;
  
  *buffer = '\0';
  bitWriter.super_BitStream.m_totalBits = 0;
  bitWriter.m_curVal = 0;
  bitWriter.m_bitWrited = 0;
  bitWriter.super_BitStream.m_buffer = (uint *)0x0;
  bitWriter.super_BitStream.m_initBuffer = (uint *)0x0;
  buffer_00 = buffer + 1;
  BitStreamWriter::setBuffer(&bitWriter,buffer_00,buffer + (long)max_buf_size + 1);
  BitStreamWriter::putBits(&bitWriter,8,2);
  puVar5 = bitWriter.super_BitStream.m_initBuffer;
  puVar3 = bitWriter.super_BitStream.m_buffer;
  uVar2 = bitWriter.m_bitWrited;
  BitStreamWriter::putBits(&bitWriter,2,2);
  BitStreamWriter::putBits(&bitWriter,2,3);
  BitStreamWriter::putBits(&bitWriter,0xc,0);
  puVar6 = bitWriter.super_BitStream.m_initBuffer;
  puVar4 = bitWriter.super_BitStream.m_buffer;
  uVar1 = bitWriter.m_bitWrited;
  BitStreamWriter::putBits(&bitWriter,0x10,(uint)this->program_number);
  BitStreamWriter::putBits(&bitWriter,2,3);
  BitStreamWriter::putBits(&bitWriter,5,0);
  BitStreamWriter::putBits(&bitWriter,1,1);
  BitStreamWriter::putBits(&bitWriter,0x10,0);
  BitStreamWriter::putBits(&bitWriter,3,7);
  BitStreamWriter::putBits(&bitWriter,0xd,this->pcr_pid);
  puVar7 = bitWriter.super_BitStream.m_initBuffer;
  iVar9 = ((int)bitWriter.super_BitStream.m_buffer - (int)bitWriter.super_BitStream.m_initBuffer) *
          8 + bitWriter.m_bitWrited;
  BitStreamWriter::putBits(&bitWriter,4,0xf);
  BitStreamWriter::putBits(&bitWriter,0xc,0);
  iVar10 = ((int)bitWriter.super_BitStream.m_buffer - (int)bitWriter.super_BitStream.m_initBuffer) *
           8 + bitWriter.m_bitWrited;
  if (CONCAT31(in_register_00000081,hdmvDescriptors) != 0) {
    BitStreamWriter::putBits(&bitWriter,8,5);
    BitStreamWriter::putBits(&bitWriter,8,4);
    BitStreamWriter::putBits(&bitWriter,0x20,0x48444d56);
    BitStreamWriter::putBits(&bitWriter,8,0x88);
    BitStreamWriter::putBits(&bitWriter,8,4);
    BitStreamWriter::putBits(&bitWriter,0x20,0xffffcfc);
  }
  if (this->casPID != 0) {
    BitStreamWriter::putBits(&bitWriter,8,9);
    BitStreamWriter::putBits(&bitWriter,8,4);
    BitStreamWriter::putBits(&bitWriter,0x10,this->casID);
    BitStreamWriter::putBits(&bitWriter,0x10,this->casPID);
  }
  uVar8 = my_ntohs(((short)((int)(((int)bitWriter.super_BitStream.m_buffer -
                                  (int)bitWriter.super_BitStream.m_initBuffer) * 8 +
                                 bitWriter.m_bitWrited) / 8) + (short)((long)iVar10 / -8)) - 0x1000)
  ;
  *(uint16_t *)((long)puVar7 + (long)(iVar9 / 8)) = uVar8;
  if (this->video_pid != 0) {
    BitStreamWriter::putBits(&bitWriter,8,this->video_type);
    BitStreamWriter::putBits(&bitWriter,3,7);
    BitStreamWriter::putBits(&bitWriter,0xd,this->video_pid);
    BitStreamWriter::putBits(&bitWriter,4,0xf);
    BitStreamWriter::putBits(&bitWriter,0xc,0);
  }
  if (this->audio_pid != 0) {
    BitStreamWriter::putBits(&bitWriter,8,this->audio_type);
    BitStreamWriter::putBits(&bitWriter,3,7);
    BitStreamWriter::putBits(&bitWriter,0xd,this->audio_pid);
    BitStreamWriter::putBits(&bitWriter,4,0xf);
    BitStreamWriter::putBits(&bitWriter,0xc,0);
  }
  if (this->sub_pid != 0) {
    BitStreamWriter::putBits(&bitWriter,8,6);
    BitStreamWriter::putBits(&bitWriter,3,7);
    BitStreamWriter::putBits(&bitWriter,0xd,this->sub_pid);
    BitStreamWriter::putBits(&bitWriter,4,0xf);
    BitStreamWriter::putBits(&bitWriter,0xc,0);
  }
  for (p_Var13 = (this->pidList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &(this->pidList)._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    value = *(uint *)&p_Var13[1]._M_parent;
    if (value == 0x90 && !hdmvDescriptors) {
      poVar12 = std::operator<<((ostream *)&std::cerr,
                                "Warning: PGS might not work without HDMV descriptors.");
      std::endl<char,std::char_traits<char>>(poVar12);
      sLastMsg = true;
      value = *(uint *)&p_Var13[1]._M_parent;
    }
    BitStreamWriter::putBits(&bitWriter,8,value);
    BitStreamWriter::putBits(&bitWriter,3,7);
    BitStreamWriter::putBits(&bitWriter,0xd,*(uint *)((long)&p_Var13[1]._M_parent + 4));
    puVar7 = bitWriter.super_BitStream.m_initBuffer;
    iVar9 = ((int)bitWriter.super_BitStream.m_buffer - (int)bitWriter.super_BitStream.m_initBuffer)
            * 8 + bitWriter.m_bitWrited;
    BitStreamWriter::putBits(&bitWriter,4,0xf);
    BitStreamWriter::putBits(&bitWriter,0xc,0);
    iVar10 = ((int)bitWriter.super_BitStream.m_buffer - (int)bitWriter.super_BitStream.m_initBuffer)
             * 8 + bitWriter.m_bitWrited;
    for (lVar14 = 0; lVar14 < *(int *)&p_Var13[1]._M_left; lVar14 = lVar14 + 1) {
      BitStreamWriter::putBits(&bitWriter,8,(uint)*(byte *)((long)&p_Var13[1]._M_right + lVar14));
    }
    if (*(char *)&p_Var13[5]._M_right != '\0' && !blurayMode) {
      BitStreamWriter::putBits(&bitWriter,8,10);
      BitStreamWriter::putBits(&bitWriter,8,4);
      for (lVar14 = -3; lVar14 != 0; lVar14 = lVar14 + 1) {
        BitStreamWriter::putBits
                  (&bitWriter,8,(int)*(char *)((long)&p_Var13[5]._M_right + lVar14 + 3));
      }
      BitStreamWriter::putBits(&bitWriter,8,0);
    }
    uVar8 = my_ntohs(((short)((int)(((int)bitWriter.super_BitStream.m_buffer -
                                    (int)bitWriter.super_BitStream.m_initBuffer) * 8 +
                                   bitWriter.m_bitWrited) / 8) + (short)(iVar10 / -8)) - 0x1000);
    *(uint16_t *)((long)puVar7 + (long)(iVar9 / 8)) = uVar8;
  }
  local_68 = (int)puVar6;
  uVar8 = my_ntohs((short)((int)(((int)bitWriter.super_BitStream.m_buffer -
                                 (int)bitWriter.super_BitStream.m_initBuffer) * 8 +
                                bitWriter.m_bitWrited) / 8) +
                   (short)((int)(uVar1 + ((int)puVar4 - local_68) * 8) / -8) + 0xb004);
  *(uint16_t *)((long)puVar5 + (long)((int)(uVar2 + ((int)puVar3 - (int)puVar5) * 8) / 8)) = uVar8;
  BitStreamWriter::flushBits(&bitWriter);
  iVar9 = ((int)bitWriter.super_BitStream.m_buffer - (int)bitWriter.super_BitStream.m_initBuffer) *
          8 + bitWriter.m_bitWrited;
  i_count = (uint64_t)(iVar9 / 8);
  uVar11 = calculateCRC32(buffer_00,i_count,iVar9 % 8);
  uVar11 = my_ntohl(uVar11);
  *(uint32_t *)(buffer_00 + i_count) = uVar11;
  return (int)(((int)bitWriter.super_BitStream.m_buffer -
               (int)bitWriter.super_BitStream.m_initBuffer) * 8 + bitWriter.m_bitWrited) / 8 + 5;
}

Assistant:

uint32_t TS_program_map_section::serialize(uint8_t* buffer, const int max_buf_size, const bool blurayMode,
                                           const bool hdmvDescriptors)
{
    buffer[0] = 0;
    buffer++;
    BitStreamWriter bitWriter{};
    bitWriter.setBuffer(buffer, buffer + max_buf_size);
    bitWriter.putBits(8, 2);  // table id

    const auto LengthPos1 = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
    bitWriter.putBits(2, 2);   // indicator
    bitWriter.putBits(2, 3);   // reserved
    bitWriter.putBits(12, 0);  // length
    const unsigned beforeCount1 = bitWriter.getBitsCount() / 8;

    bitWriter.putBits(16, program_number);
    bitWriter.putBits(2, 3);         // reserved
    bitWriter.putBits(5, 0);         // version_number
    bitWriter.putBits(1, 1);         // current next indicator
    bitWriter.putBits(16, 0);        // section_number and last_section_number
    bitWriter.putBits(3, 7);         // reserved
    bitWriter.putBits(13, pcr_pid);  // reserved

    const auto LengthPos2 = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
    bitWriter.putBits(4, 15);  // reserved
    bitWriter.putBits(12, 0);  // program info len
    const unsigned beforeCount2 = bitWriter.getBitsCount() / 8;

    if (hdmvDescriptors)
    {
        // put 'HDMV' registration descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::HDMV));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(32, 0x48444d56);

        // put DTCP descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::COPY_CONTROL));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(32, 0x0ffffcfc);
    }

    if (casPID)
    {
        // put CAS descriptor
        bitWriter.putBits(8, static_cast<uint8_t>(TSDescriptorTag::CAS));
        bitWriter.putBits(8, 0x04);
        bitWriter.putBits(16, casID);
        bitWriter.putBits(16, casPID);
    }
    *LengthPos2 = my_htons(static_cast<uint16_t>(0xf000 + bitWriter.getBitsCount() / 8 - beforeCount2));

    if (video_pid)
    {
        bitWriter.putBits(8, video_type);
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, video_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    if (audio_pid)
    {
        bitWriter.putBits(8, audio_type);
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, audio_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    if (sub_pid)
    {
        bitWriter.putBits(8, static_cast<uint8_t>(StreamType::SUB_DVB));
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, sub_pid);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
    }

    for (const auto& [pid, si] : pidList)
    {
        if (si.m_streamType == StreamType::SUB_PGS && !hdmvDescriptors)
            LTRACE(LT_WARN, 2, "Warning: PGS might not work without HDMV descriptors.");

        bitWriter.putBits(8, static_cast<int>(si.m_streamType));
        bitWriter.putBits(3, 7);  // reserved
        bitWriter.putBits(13, si.m_pid);

        const auto esInfoLen = reinterpret_cast<uint16_t*>(bitWriter.getBuffer() + bitWriter.getBitsCount() / 8);
        bitWriter.putBits(4, 15);  // reserved
        bitWriter.putBits(12, 0);  // es_info_len
        const unsigned beforeCount = bitWriter.getBitsCount() / 8;

        for (int j = 0; j < si.m_esInfoLen; j++) bitWriter.putBits(8, si.m_esInfoData[j]);  // es_info_len

        if (*si.m_lang && !blurayMode)
        {
            bitWriter.putBits(8, static_cast<unsigned>(TSDescriptorTag::LANG));  // lang descriptor ID
            bitWriter.putBits(8, 4);                                             // lang descriptor len
            for (int k = 0; k < 3; k++) bitWriter.putBits(8, si.m_lang[k]);      // lang code[i]
            bitWriter.putBits(8, 0);
        }
        *esInfoLen = my_htons(static_cast<uint16_t>(0xf000 + bitWriter.getBitsCount() / 8 - beforeCount));
    }
    *LengthPos1 = my_htons(static_cast<uint16_t>(0xb000 + bitWriter.getBitsCount() / 8 - beforeCount1 + 4));
    bitWriter.flushBits();

    const uint32_t crc = calculateCRC32(buffer, bitWriter.getBitsCount() / 8);

    const auto crcPtr = reinterpret_cast<uint32_t*>(buffer + bitWriter.getBitsCount() / 8);
    *crcPtr = my_htonl(crc);

    return bitWriter.getBitsCount() / 8 + 5;
}